

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Abc_Obj_t *
Abc_NodeFromMapSuper_rec
          (Abc_Ntk_t *pNtkNew,Map_Node_t *pNodeMap,Map_Super_t *pSuper,Abc_Obj_t **pNodePis,
          int nNodePis)

{
  uint uVar1;
  int iVar2;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar3;
  char *pName;
  Map_Super_t **ppMVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pFanin;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pMVar3 = Map_SuperReadRoot(pSuper);
  if (pMVar3 == (Mio_Gate_t *)0x0) {
    iVar2 = Map_SuperReadNum(pSuper);
    if (nNodePis <= iVar2) {
      pAVar5 = Abc_NtkCreateNodeConst0(pNtkNew);
      return pAVar5;
    }
    pAVar5 = pNodePis[iVar2];
  }
  else {
    pName = Mio_GateReadName(pMVar3);
    pMVar3 = Mio_LibraryReadGateByName(pLib,pName,(char *)0x0);
    uVar1 = Map_SuperReadFaninNum(pSuper);
    ppMVar4 = Map_SuperReadFanins(pSuper);
    pAVar5 = Abc_NtkCreateNode(pNtkNew);
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pFanin = Abc_NodeFromMapSuper_rec(pNtkNew,pNodeMap,ppMVar4[uVar6],pNodePis,nNodePis);
      Abc_ObjAddFanin(pAVar5,pFanin);
    }
    (pAVar5->field_5).pData = pMVar3;
  }
  return pAVar5;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMapSuper_rec( Abc_Ntk_t * pNtkNew, Map_Node_t * pNodeMap, Map_Super_t * pSuper, Abc_Obj_t * pNodePis[], int nNodePis )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_Gate_t * pRoot;
    Map_Super_t ** ppFanins;
    Abc_Obj_t * pNodeNew, * pNodeFanin;
    int nFanins, Number, i;

    // get the parameters of the supergate
    pRoot = Map_SuperReadRoot(pSuper);
    if ( pRoot == NULL )
    {
        Number = Map_SuperReadNum(pSuper);
        if ( Number < nNodePis )  
        {
            return pNodePis[Number];
        }
        else
        {  
//            assert( 0 );
            /* It might happen that a super gate with 5 inputs is constructed that
             * actually depends only on the first four variables; i.e the fifth is a
             * don't care -- in that case we connect constant node for the fifth
             * (since the cut only has 4 variables). An interesting question is what
             * if the first variable (and not the fifth one is the redundant one;
             * can that happen?) */
            return Abc_NtkCreateNodeConst0(pNtkNew);
        }
    }
    pRoot = Mio_LibraryReadGateByName( pLib, Mio_GateReadName(pRoot), NULL );

    // get information about the fanins of the supergate
    nFanins  = Map_SuperReadFaninNum( pSuper );
    ppFanins = Map_SuperReadFanins( pSuper );
    // create a new node with these fanins
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < nFanins; i++ )
    {
        pNodeFanin = Abc_NodeFromMapSuper_rec( pNtkNew, pNodeMap, ppFanins[i], pNodePis, nNodePis );
        Abc_ObjAddFanin( pNodeNew, pNodeFanin );
    }
    pNodeNew->pData = pRoot;
    return pNodeNew;
}